

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O2

void tc_uECC_vli_mmod(tc_uECC_word_t *result,tc_uECC_word_t *product,tc_uECC_word_t *mod,
                     wordcount_t num_words)

{
  int iVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  undefined7 in_register_00000009;
  char cVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  tc_uECC_word_t atStack_298 [114];
  tc_uECC_word_t tmp [16];
  tc_uECC_word_t mod_multiple [16];
  tc_uECC_word_t *v [2];
  
  iVar4 = (int)CONCAT71(in_register_00000009,num_words);
  v[0] = product;
  uVar3 = tc_uECC_vli_numBits(mod,num_words);
  uVar9 = iVar4 * 0x40 - (uint)uVar3;
  uVar7 = (uint)(ushort)((short)uVar9 >> 0xf) << 0x10 | uVar9 & 0xffff;
  iVar1 = (int)uVar7 % 0x20;
  cVar5 = (char)((int)uVar7 / 0x20);
  tc_uECC_vli_clear(tmp + 0xe,cVar5);
  if ((short)iVar1 < 1) {
    tc_uECC_vli_set(tmp + (long)(int)cVar5 + 0xe,mod,num_words);
  }
  else {
    bVar2 = (byte)iVar1;
    uVar7 = 0;
    for (uVar6 = 0; (CONCAT71(in_register_00000009,num_words) & 0xffffffff) != uVar6;
        uVar6 = uVar6 + 1) {
      uVar8 = mod[uVar6] << (bVar2 & 0x1f) | uVar7;
      uVar7 = mod[uVar6] >> (0x20 - bVar2 & 0x1f);
      tmp[(ulong)(uint)((int)cVar5 + (int)uVar6) + 0xe] = uVar8;
    }
  }
  uVar6 = 1;
  for (; -1 < (short)uVar9; uVar9 = uVar9 - 1) {
    uVar7 = 0;
    for (cVar5 = '\0'; (int)cVar5 < iVar4 * 2; cVar5 = cVar5 + '\x01') {
      uVar8 = tmp[(long)cVar5 + 0xe] + uVar7;
      if (uVar8 != 0) {
        uVar7 = (uint)(v[uVar6 - 1][cVar5] < uVar8);
      }
      v[(ulong)((uint)uVar6 ^ 1) - 1][cVar5] = v[uVar6 - 1][cVar5] - uVar8;
    }
    uVar6 = (ulong)((uint)uVar6 == uVar7);
    tc_uECC_vli_rshift1(tmp + 0xe,num_words);
    tmp[(long)(iVar4 + -1) + 0xe] =
         tmp[(long)(iVar4 + -1) + 0xe] | tmp[(long)num_words + 0xe] << 0x1f;
    tc_uECC_vli_rshift1(tmp + (long)num_words + 0xe,num_words);
  }
  tc_uECC_vli_set(result,v[uVar6 - 1],num_words);
  return;
}

Assistant:

void tc_uECC_vli_mmod(tc_uECC_word_t *result, tc_uECC_word_t *product,
    		   const tc_uECC_word_t *mod, wordcount_t num_words)
{
	tc_uECC_word_t mod_multiple[2 * NUM_ECC_WORDS];
	tc_uECC_word_t tmp[2 * NUM_ECC_WORDS];
	tc_uECC_word_t *v[2] = {tmp, product};
	tc_uECC_word_t index;

	/* Shift mod so its highest set bit is at the maximum position. */
	bitcount_t shift = (num_words * 2 * tc_uECC_WORD_BITS) -
			   tc_uECC_vli_numBits(mod, num_words);
	wordcount_t word_shift = shift / tc_uECC_WORD_BITS;
	wordcount_t bit_shift = shift % tc_uECC_WORD_BITS;
	tc_uECC_word_t carry = 0;
	tc_uECC_vli_clear(mod_multiple, word_shift);
	if (bit_shift > 0) {
		for(index = 0; index < (tc_uECC_word_t)num_words; ++index) {
			mod_multiple[word_shift + index] = (mod[index] << bit_shift) | carry;
			carry = mod[index] >> (tc_uECC_WORD_BITS - bit_shift);
		}
	} else {
		tc_uECC_vli_set(mod_multiple + word_shift, mod, num_words);
	}

	for (index = 1; shift >= 0; --shift) {
		tc_uECC_word_t borrow = 0;
		wordcount_t i;
		for (i = 0; i < num_words * 2; ++i) {
			tc_uECC_word_t diff = v[index][i] - mod_multiple[i] - borrow;
			if (diff != v[index][i]) {
				borrow = (diff > v[index][i]);
			}
			v[1 - index][i] = diff;
		}
		/* Swap the index if there was no borrow */
		index = !(index ^ borrow);
		tc_uECC_vli_rshift1(mod_multiple, num_words);
		mod_multiple[num_words - 1] |= mod_multiple[num_words] <<
					       (tc_uECC_WORD_BITS - 1);
		tc_uECC_vli_rshift1(mod_multiple + num_words, num_words);
	}
	tc_uECC_vli_set(result, v[index], num_words);
}